

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<float> fmt::v8::detail::dragonbox::to_decimal<float>(float x)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  char cVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  
  uVar18 = (uint)x & 0x7fffff;
  if (((uint)x & 0x7f800000) == 0) {
    uVar15 = 0xffffff6b;
    if (uVar18 == 0) {
      uVar14 = 0;
      uVar10 = 0;
      goto LAB_00116533;
    }
LAB_0011625d:
    uVar13 = (int)(uVar15 * 0x134413) >> 0x16;
    uVar14 = (ulong)uVar13;
    iVar16 = uVar13 - 1;
    uVar1 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x20 - uVar13) * 8);
    bVar8 = (char)((int)((1 - uVar13) * 0x1a934f) >> 0x13) + (char)uVar15;
    uVar17 = uVar18 * 2;
    iVar3 = uVar18 * 2 + 1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4 = ZEXT416((uint)(iVar3 << (bVar8 & 0x1f))) * auVar4;
    uVar6 = auVar4._8_8_ * 0x51eb851f;
    uVar7 = uVar6 >> 0x25;
    uVar10 = (uint)(uVar6 >> 0x20);
    uVar5 = uVar10 >> 5;
    uVar9 = (uVar10 >> 5) * -100 + auVar4._8_4_;
    uVar11 = (uint)(uVar1 >> (~bVar8 & 0x3f));
    if (uVar9 <= uVar11) {
      if (uVar9 < uVar11) {
        if (((((uVar18 & 1) == 0) || ((int)uVar15 < -1)) || (uVar9 != 0)) ||
           ((6 < (int)uVar15 &&
            ((0x27 < (int)uVar15 ||
             (*(uint *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                       (long)iVar16 * 8 + 4) <
              (uint)(iVar3 * *(int *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                                     (long)iVar16 * 8)))))))) {
LAB_001164d5:
          uVar15 = uVar10 >> 5 | 0x80;
          uVar18 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          uVar15 = 0;
          uVar10 = uVar10 >> 5;
          if (1 < uVar18) {
            uVar15 = 0;
            do {
              uVar17 = (uint)uVar7 * -0x3d70a3d7;
              uVar10 = (uint)uVar7;
              if (0xa3d70a3 < uVar17) goto LAB_00116512;
              uVar15 = uVar15 + 2;
              uVar7 = (ulong)uVar17;
            } while ((int)uVar15 < (int)(uVar18 - 1));
            goto LAB_0011650d;
          }
          goto LAB_00116512;
        }
        uVar5 = (uVar10 >> 5) - 1;
        uVar9 = 100;
      }
      else if (((-2 < (int)uVar15 && (uVar18 & 1) == 0) &&
               (((int)uVar15 < 7 ||
                (((int)uVar15 < 0x28 &&
                 (*(int *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                          (long)iVar16 * 8) * (uVar17 - 1) <=
                  *(uint *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                           (long)iVar16 * 8 + 4))))))) ||
              (((uVar17 - 1) * uVar1 >> ((ulong)(byte)(0x40 - bVar8) & 0x3f) & 1) != 0))
      goto LAB_001164d5;
    }
    uVar10 = (uVar9 - (uVar11 >> 1)) + 5;
    if ((uVar10 & 1) == 0) {
      uVar9 = (uVar10 >> 1) * 0xcccd;
      uVar10 = (uVar9 >> 0x12) + uVar5 * 10;
      if ((uVar9 & 0xfffc) < 0x3334) {
        if ((uVar1 * uVar17 >> ((ulong)(byte)(0x40 - bVar8) & 0x3f) & 1) == 0) {
          uVar10 = uVar10 - 1;
        }
        else {
          if ((int)uVar15 < 0x28) {
            if ((int)uVar15 < 7) {
              bVar2 = true;
              if ((int)uVar15 < -2) {
                iVar3 = 0;
                if (uVar18 != 0) {
                  for (; (uVar17 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
                  }
                }
                bVar2 = (int)(iVar16 - uVar15) < iVar3;
              }
            }
            else {
              bVar2 = uVar17 * *(int *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                                       (long)iVar16 * 8) <=
                      *(uint *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                               (long)iVar16 * 8 + 4);
            }
          }
          else {
            bVar2 = false;
          }
          if (bVar2) {
            uVar10 = uVar10 & 0xfffffffe;
          }
        }
      }
    }
    else {
      uVar10 = (uVar10 * 0xcccd >> 0x13) + uVar5 * 10;
    }
  }
  else {
    uVar15 = (((uint)x & 0x7f800000) >> 0x17) - 0x96;
    if (uVar18 != 0) {
      uVar18 = uVar18 | 0x800000;
      goto LAB_0011625d;
    }
    uVar13 = (int)(uVar15 * 0x134413 + -0x7feff) >> 0x16;
    uVar14 = (ulong)uVar13;
    cVar12 = (char)((int)(uVar13 * -0x1a934f) >> 0x13) + (char)uVar15;
    uVar1 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x1f - uVar13) * 8);
    bVar8 = 0x28 - cVar12;
    uVar18 = (uint)((uVar15 & 0xfffffffe) != 2) + (int)(uVar1 - (uVar1 >> 0x19) >> (bVar8 & 0x3f));
    uVar7 = (uVar1 >> 0x18) + uVar1 >> (bVar8 & 0x3f) & 0xffffffff;
    uVar6 = uVar7 / 10;
    uVar10 = (uint)uVar6;
    if ((uint)((int)(uVar7 / 10) * 10) < uVar18) {
      uVar10 = (int)(uVar1 >> (0x27U - cVar12 & 0x3f)) + 1U >> 1;
      if (uVar15 == 0xffffffdd) {
        uVar10 = uVar10 & 0xfffffffe;
      }
      else {
        uVar10 = uVar10 + (uVar10 < uVar18);
      }
      goto LAB_00116533;
    }
    uVar15 = (uint)(uVar7 / 10) | 0x80;
    uVar18 = 0;
    if (uVar15 != 0) {
      for (; (uVar15 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
      }
    }
    uVar15 = 0;
    if (1 < uVar18) {
      uVar15 = 0;
      do {
        uVar10 = (uint)uVar6;
        uVar17 = uVar10 * -0x3d70a3d7;
        if (0xa3d70a3 < uVar17) goto LAB_00116512;
        uVar15 = uVar15 + 2;
        uVar6 = (ulong)uVar17;
      } while ((int)uVar15 < (int)(uVar18 - 1));
LAB_0011650d:
      uVar15 = uVar18 & 0xfffffffe;
      uVar10 = uVar17;
    }
LAB_00116512:
    if (uVar15 < uVar18) {
      uVar18 = uVar10 * -0x33333333;
      if (uVar18 < 0x33333334) {
        uVar10 = uVar18;
      }
      uVar15 = uVar15 | uVar18 < 0x33333334;
    }
    uVar14 = (ulong)(uVar13 + 1 + uVar15);
    uVar10 = uVar10 >> ((byte)uVar15 & 0x1f);
  }
LAB_00116533:
  return (decimal_fp<float>)((ulong)uVar10 | uVar14 << 0x20);
}

Assistant:

FMT_CONSTEXPR fp normalize(fp value) {
  // Handle subnormals.
  const uint64_t implicit_bit = 1ULL << num_significand_bits<double>();
  const auto shifted_implicit_bit = implicit_bit << SHIFT;
  while ((value.f & shifted_implicit_bit) == 0) {
    value.f <<= 1;
    --value.e;
  }
  // Subtract 1 to account for hidden bit.
  const auto offset =
      fp::num_significand_bits - num_significand_bits<double>() - SHIFT - 1;
  value.f <<= offset;
  value.e -= offset;
  return value;
}